

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

uint64_t __thiscall rcg::Buffer::getTimestamp(Buffer *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  exception *anon_var_0;
  bool in_stack_000001e6;
  bool in_stack_000001e7;
  int64_t *in_stack_000001e8;
  int64_t *in_stack_000001f0;
  char *in_stack_000001f8;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_00000200;
  undefined8 in_stack_ffffffffffffffc8;
  BUFFER_INFO_CMD cmd;
  void *in_stack_ffffffffffffffd8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffe0;
  unsigned_long local_8;
  
  cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((in_RDI[4] == 4) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6)), bVar1)) {
    local_8 = getInteger(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                         in_stack_000001e7,in_stack_000001e6);
  }
  else {
    Stream::getHandle((Stream *)*in_RDI);
    local_8 = anon_unknown_5::getBufferValue<unsigned_long>
                        (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,cmd);
  }
  return local_8;
}

Assistant:

uint64_t Buffer::getTimestamp() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
  {
    try
    {
      return getInteger(nodemap, "ChunkTimestamp", 0, 0, true);
    }
    catch (const std::exception &)
    {
      // ignore error and try getBufferValue()
    }
  }

  return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                  GenTL::BUFFER_INFO_TIMESTAMP);
}